

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcRootLogLikelihoodsMulti
          (BeagleCPUImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *scaleBufferIndices,int count,double *outSumLogLikelihood
          )

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double **ppdVar8;
  uint uVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  int k;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  double dVar17;
  int iVar18;
  int *piVar19;
  int iVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vector<double,_std::allocator<double>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  allocator_type local_b1;
  int *local_b0;
  ulong local_a8;
  double local_a0;
  double local_98;
  ulong local_90;
  int *local_88;
  int *local_80;
  int *local_78;
  long local_70;
  ulong local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar15 = (ulong)(uint)count;
  local_b0 = scaleBufferIndices;
  local_88 = bufferIndices;
  local_80 = categoryWeightsIndices;
  local_78 = stateFrequenciesIndices;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)this->kPatternCount,(allocator_type *)&local_60);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,(long)this->kPatternCount,&local_b1);
  piVar19 = local_b0;
  local_90 = uVar15;
  if (0 < count) {
    local_68 = (ulong)(count - 1);
    uVar14 = 0;
    local_a0 = (double)uVar15;
    do {
      local_70 = (long)local_88[uVar14];
      pdVar10 = this->gPartials[local_70];
      pdVar5 = this->gStateFrequencies[local_78[uVar14]];
      pdVar6 = this->gCategoryWeights[local_80[uVar14]];
      iVar21 = this->kPatternCount;
      iVar13 = 0;
      if (0 < iVar21) {
        iVar4 = this->kStateCount;
        pdVar7 = this->integrationTmp;
        iVar16 = 0;
        iVar13 = 0;
        iVar18 = 0;
        do {
          if (0 < iVar4) {
            iVar20 = 0;
            lVar12 = 0;
            do {
              *(double *)((long)pdVar7 + lVar12 + (long)iVar18 * 8) =
                   *(double *)((long)pdVar10 + lVar12 + (long)iVar13 * 8) * *pdVar6;
              lVar12 = lVar12 + 8;
              iVar20 = iVar20 + -1;
            } while (-iVar4 != iVar20);
            iVar18 = iVar18 - iVar20;
            iVar13 = iVar13 - iVar20;
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 != iVar21);
      }
      local_98 = (double)(long)this->kCategoryCount;
      if (1 < (long)local_98) {
        iVar4 = this->kStateCount;
        dVar17 = 4.94065645841247e-324;
        do {
          if (0 < iVar21) {
            pdVar7 = this->integrationTmp;
            iVar16 = 0;
            iVar18 = 0;
            do {
              if (0 < iVar4) {
                iVar20 = 0;
                lVar12 = 0;
                do {
                  auVar22._8_8_ = 0;
                  auVar22._0_8_ = *(ulong *)((long)pdVar10 + lVar12 + (long)iVar13 * 8);
                  auVar25._8_8_ = 0;
                  auVar25._0_8_ = pdVar6[(long)dVar17];
                  auVar27._8_8_ = 0;
                  auVar27._0_8_ = *(ulong *)((long)pdVar7 + lVar12 + (long)iVar18 * 8);
                  auVar27 = vfmadd213sd_fma(auVar25,auVar22,auVar27);
                  *(long *)((long)pdVar7 + lVar12 + (long)iVar18 * 8) = auVar27._0_8_;
                  lVar12 = lVar12 + 8;
                  iVar20 = iVar20 + -1;
                } while (-iVar4 != iVar20);
                iVar18 = iVar18 - iVar20;
                iVar13 = iVar13 - iVar20;
              }
              iVar16 = iVar16 + 1;
            } while (iVar16 != iVar21);
          }
          dVar17 = (double)((long)dVar17 + 1);
        } while (dVar17 != local_98);
      }
      piVar19 = local_b0;
      local_a8 = uVar14;
      if (0 < this->kPatternCount) {
        lVar12 = 0;
        iVar21 = 0;
        do {
          iVar13 = this->kStateCount;
          if ((long)iVar13 < 1) {
            dVar17 = 0.0;
          }
          else {
            auVar27 = ZEXT816(0);
            lVar11 = 0;
            do {
              auVar23._8_8_ = 0;
              auVar23._0_8_ = pdVar5[lVar11];
              auVar2._8_8_ = 0;
              auVar2._0_8_ = this->integrationTmp[iVar21 + lVar11];
              auVar27 = vfmadd231sd_fma(auVar27,auVar23,auVar2);
              dVar17 = auVar27._0_8_;
              lVar11 = lVar11 + 1;
            } while (iVar13 != lVar11);
            iVar21 = iVar21 + iVar13;
          }
          if ((*piVar19 != -1) || ((this->kFlags & 0x100) != 0)) {
            uVar9 = (uint)this->kFlags;
            if ((uVar9 >> 8 & 1) == 0) {
              iVar13 = piVar19[uVar14];
            }
            else {
              iVar13 = (int)local_70 - this->kTipCount;
            }
            ppdVar8 = this->gScaleBuffers;
            pdVar10 = ppdVar8[iVar13];
            if (uVar14 == 0) {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar12] = 0;
              local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12] = pdVar10[lVar12];
              if ((int)local_90 != 1) {
                auVar24 = ZEXT864((ulong)local_60.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[lVar12]);
                uVar15 = 1;
                do {
                  if ((uVar9 >> 8 & 1) == 0) {
                    iVar13 = piVar19[uVar15];
                  }
                  else {
                    iVar13 = local_88[uVar15] - this->kTipCount;
                  }
                  dVar1 = ppdVar8[iVar13][lVar12];
                  if (auVar24._0_8_ < dVar1) {
                    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12] = (int)uVar15;
                    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12] = dVar1;
                    auVar24 = ZEXT864((ulong)dVar1);
                  }
                  uVar15 = uVar15 + 1;
                } while (local_a0 != (double)uVar15);
              }
            }
            uVar14 = local_a8;
            if (local_a8 !=
                (uint)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar12]) {
              local_98 = dVar17;
              dVar17 = exp(pdVar10[lVar12] -
                           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar12]);
              dVar17 = local_98 * dVar17;
              uVar14 = local_a8;
              piVar19 = local_b0;
            }
          }
          if (uVar14 == 0) {
            this->outLogLikelihoodsTmp[lVar12] = dVar17;
          }
          else {
            if (uVar14 == local_68) {
              dVar17 = log(dVar17 + this->outLogLikelihoodsTmp[lVar12]);
              pdVar10 = this->outLogLikelihoodsTmp;
              uVar14 = local_a8;
              piVar19 = local_b0;
            }
            else {
              pdVar10 = this->outLogLikelihoodsTmp;
              dVar17 = dVar17 + pdVar10[lVar12];
            }
            pdVar10[lVar12] = dVar17;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < this->kPatternCount);
      }
      uVar14 = uVar14 + 1;
    } while ((double)uVar14 != local_a0);
  }
  if (((*piVar19 != -1) || ((this->kFlags & 0x100) != 0)) &&
     (iVar21 = this->kPatternCount, 0 < (long)iVar21)) {
    pdVar10 = this->outLogLikelihoodsTmp;
    lVar12 = 0;
    do {
      pdVar10[lVar12] =
           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar12] + pdVar10[lVar12];
      lVar12 = lVar12 + 1;
    } while (iVar21 != lVar12);
  }
  *outSumLogLikelihood = 0.0;
  iVar21 = this->kPatternCount;
  if (0 < (long)iVar21) {
    pdVar10 = this->gPatternWeights;
    pdVar5 = this->outLogLikelihoodsTmp;
    auVar24 = ZEXT864((ulong)*outSumLogLikelihood);
    lVar12 = 0;
    do {
      auVar26._8_8_ = 0;
      auVar26._0_8_ = pdVar5[lVar12];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = pdVar10[lVar12];
      auVar27 = vfmadd231sd_fma(auVar24._0_16_,auVar26,auVar3);
      auVar24 = ZEXT1664(auVar27);
      *outSumLogLikelihood = auVar27._0_8_;
      lVar12 = lVar12 + 1;
    } while (iVar21 != lVar12);
  }
  local_a0 = *outSumLogLikelihood;
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (uint)(!NAN(local_a0) && !NAN(local_a0)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsMulti(const int* bufferIndices,
                                                         const int* categoryWeightsIndices,
                                                         const int* stateFrequenciesIndices,
                                                         const int* scaleBufferIndices,
                                                         int count,
                                                         double* outSumLogLikelihood) {
    // Here we do the 3 similar operations:
    //              1. to set the lnL to the contribution of the first subset,
    //              2. to add the lnL for other subsets up to the penultimate
    //              3. to add the final subset and take the lnL
    //      This form of the calc would not work when count == 1 because
    //              we need operation 1 and 3 in the preceding list.  This is not
    //              a problem, though as we deal with count == 1 in the previous
    //              branch.

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    int returnCode = BEAGLE_SUCCESS;

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const int rootPartialIndex = bufferIndices[subsetIndex];
        const REALTYPE* rootPartials = gPartials[rootPartialIndex];
        const REALTYPE* frequencies = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        int u = 0;
        int v = 0;
        for (int k = 0; k < kPatternCount; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
                u++;
                v++;
            }
            v += P_PAD;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = 0;
            for (int k = 0; k < kPatternCount; k++) {
                for (int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                    u++;
                    v++;
                }
                v += P_PAD;
            }
        }
        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += ((REALTYPE)frequencies[i]) * integrationTmp[u];
                u++;
            }

            // TODO: allow only some subsets to have scale indices
            if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
                int cumulativeScalingFactorIndex;
                if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                    cumulativeScalingFactorIndex = rootPartialIndex - kTipCount;
                else
                    cumulativeScalingFactorIndex = scaleBufferIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                            tmpScaleFactor = gScaleBuffers[bufferIndices[j] - kTipCount][k];
                        else
                            tmpScaleFactor = gScaleBuffers[scaleBufferIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sum *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }

            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sum;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sum;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sum;
            }
        }
    }

    if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;

}